

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundShape.cpp
# Opt level: O0

void __thiscall btCompoundShape::createAabbTreeFromChildren(btCompoundShape *this)

{
  int iVar1;
  btDbvtNode *volume;
  btDbvtNode *pbVar2;
  btDbvt *in_RDI;
  size_t index2;
  btDbvtVolume bounds;
  btVector3 localAabbMax;
  btVector3 localAabbMin;
  btCompoundShapeChild *child;
  int index;
  void *mem;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar3;
  btVector3 local_40;
  btVector3 local_30;
  btCompoundShapeChild *local_20;
  int local_14;
  btDbvtNode *local_10;
  
  if (in_RDI[1].m_root == (btDbvtNode *)0x0) {
    volume = (btDbvtNode *)
             btAlignedAllocInternal
                       (CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff7c);
    local_10 = volume;
    btDbvt::btDbvt(in_RDI);
    in_RDI[1].m_root = volume;
    local_14 = 0;
    while (iVar3 = local_14,
          iVar1 = btAlignedObjectArray<btCompoundShapeChild>::size
                            ((btAlignedObjectArray<btCompoundShapeChild> *)&in_RDI->m_stkStack),
          iVar3 < iVar1) {
      local_20 = btAlignedObjectArray<btCompoundShapeChild>::operator[]
                           ((btAlignedObjectArray<btCompoundShapeChild> *)&in_RDI->m_stkStack,
                            local_14);
      btVector3::btVector3(&local_30);
      btVector3::btVector3(&local_40);
      (*local_20->m_childShape->_vptr_btCollisionShape[2])
                (local_20->m_childShape,local_20,&local_30,&local_40);
      btDbvtAabbMm::FromMM((btVector3 *)in_RDI,(btVector3 *)volume);
      pbVar2 = btDbvt::insert(in_RDI,&volume->volume,
                              (void *)CONCAT44(iVar3,in_stack_ffffffffffffff80));
      local_20->m_node = pbVar2;
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void btCompoundShape::createAabbTreeFromChildren()
{
    if ( !m_dynamicAabbTree )
    {
        void* mem = btAlignedAlloc(sizeof(btDbvt),16);
        m_dynamicAabbTree = new(mem) btDbvt();
        btAssert(mem==m_dynamicAabbTree);

        for ( int index = 0; index < m_children.size(); index++ )
        {
            btCompoundShapeChild &child = m_children[index];

            //extend the local aabbMin/aabbMax
            btVector3 localAabbMin,localAabbMax;
            child.m_childShape->getAabb(child.m_transform,localAabbMin,localAabbMax);

            const btDbvtVolume  bounds=btDbvtVolume::FromMM(localAabbMin,localAabbMax);
			size_t index2 = index;
            child.m_node = m_dynamicAabbTree->insert(bounds, reinterpret_cast<void*>(index2) );
        }
    }
}